

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O2

int64_t celero::GetRAMSystemAvailable(void)

{
  int64_t iVar1;
  int64_t iVar2;
  
  iVar1 = GetRAMSystemTotal();
  iVar2 = GetRAMSystemUsed();
  return iVar1 - iVar2;
}

Assistant:

int64_t celero::GetRAMSystemAvailable()
{
#ifdef _WIN32
	MEMORYSTATUSEX memInfo;
	memInfo.dwLength = sizeof(MEMORYSTATUSEX);
	GlobalMemoryStatusEx(&memInfo);
	return static_cast<int64_t>(memInfo.ullAvailPhys) + static_cast<int64_t>(memInfo.ullAvailVirtual);
#else
	return celero::GetRAMSystemTotal() - celero::GetRAMSystemUsed();
#endif
}